

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O1

BufferBlock * __thiscall
deqp::gles31::bb::ShaderInterface::allocBlock(ShaderInterface *this,char *name)

{
  BufferBlock *this_00;
  BufferBlock *local_28;
  
  std::vector<deqp::gles31::bb::BufferBlock_*,_std::allocator<deqp::gles31::bb::BufferBlock_*>_>::
  reserve(&this->m_bufferBlocks,
          ((long)(this->m_bufferBlocks).
                 super__Vector_base<deqp::gles31::bb::BufferBlock_*,_std::allocator<deqp::gles31::bb::BufferBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_bufferBlocks).
                 super__Vector_base<deqp::gles31::bb::BufferBlock_*,_std::allocator<deqp::gles31::bb::BufferBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
  this_00 = (BufferBlock *)operator_new(0x80);
  BufferBlock::BufferBlock(this_00,name);
  local_28 = this_00;
  std::vector<deqp::gles31::bb::BufferBlock*,std::allocator<deqp::gles31::bb::BufferBlock*>>::
  emplace_back<deqp::gles31::bb::BufferBlock*>
            ((vector<deqp::gles31::bb::BufferBlock*,std::allocator<deqp::gles31::bb::BufferBlock*>>
              *)&this->m_bufferBlocks,&local_28);
  return (this->m_bufferBlocks).
         super__Vector_base<deqp::gles31::bb::BufferBlock_*,_std::allocator<deqp::gles31::bb::BufferBlock_*>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1];
}

Assistant:

BufferBlock& ShaderInterface::allocBlock (const char* name)
{
	m_bufferBlocks.reserve(m_bufferBlocks.size()+1);
	m_bufferBlocks.push_back(new BufferBlock(name));
	return *m_bufferBlocks.back();
}